

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_435779::cmCMakeLanguageCommandDEFER
               (Defer *defer,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,size_t arg,cmExecutionStatus *status)

{
  bool *this;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  string *psVar6;
  cmMakefile *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string_view view;
  cmMakefile *local_6a0;
  cmAlphaNum local_698;
  string_view local_668;
  size_t local_658;
  char *pcStack_650;
  cmAlphaNum local_648;
  string local_618;
  string_view local_5f8;
  string_view local_5e8;
  cmAlphaNum local_5d8;
  string_view local_5a8;
  string_view local_598;
  cmAlphaNum local_580;
  string local_550;
  undefined1 local_530 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> call;
  cmAlphaNum local_4b0;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  const_reference local_410;
  string *var_1;
  string local_400;
  const_reference local_3e0;
  string *id_1;
  string local_3d0;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  size_t local_3a0;
  char *local_398;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_390;
  string_view local_380;
  undefined4 local_36c;
  string_view local_368;
  cmAlphaNum local_358;
  string_view local_328;
  string_view local_318;
  cmAlphaNum local_308;
  string local_2d8;
  undefined1 local_2b8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ids_1;
  string local_288;
  const_reference local_268;
  string *var;
  string local_258;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  size_t local_228;
  char *local_220;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_218;
  string_view local_208;
  cmAlphaNum local_1f8;
  string_view local_1c8;
  size_t local_1b8;
  char *pcStack_1b0;
  cmAlphaNum local_1a8;
  string local_178;
  cmAlphaNum local_148;
  string_view local_118;
  size_t local_108;
  char *pcStack_100;
  cmAlphaNum local_f8;
  string local_c8;
  reference local_a8;
  string *id;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin2;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2;
  undefined1 local_78 [8];
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ids;
  cmMakefile *deferMakefile;
  cmExecutionStatus *status_local;
  size_t arg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  Defer *defer_local;
  
  if (defer->Directory == (cmMakefile *)0x0) {
    local_6a0 = cmExecutionStatus::GetMakefile(status);
  }
  else {
    local_6a0 = defer->Directory;
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,arg);
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar2);
  join_0x00000010_0x00000000_ =
       (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CANCEL_CALL",0xb);
  bVar1 = std::operator==(__x,join_0x00000010_0x00000000_);
  if (bVar1) {
    ___range2 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          (args);
    _local_78 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&__range2,arg + 1);
    __end2 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78);
    id = (string *)
         cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&id), bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
      if (('@' < *pcVar5) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_a8), *pcVar5 < '[')) {
        local_118 = (string_view)::cm::operator____s("DEFER CANCEL_CALL unknown argument:\n  ",0x26)
        ;
        local_108 = local_118._M_len;
        pcStack_100 = local_118._M_str;
        cmAlphaNum::cmAlphaNum(&local_f8,local_118);
        cmAlphaNum::cmAlphaNum(&local_148,local_a8);
        cmStrCat<>(&local_c8,&local_f8,&local_148);
        bVar1 = FatalError(status,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        return bVar1;
      }
      bVar1 = cmMakefile::DeferCancelCall(local_6a0,local_a8);
      if (!bVar1) {
        local_1c8 = (string_view)
                    ::cm::operator____s("DEFER CANCEL_CALL may not update directory:\n  ",0x2e);
        local_1b8 = local_1c8._M_len;
        pcStack_1b0 = local_1c8._M_str;
        cmAlphaNum::cmAlphaNum(&local_1a8,local_1c8);
        psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_6a0);
        cmAlphaNum::cmAlphaNum(&local_1f8,psVar6);
        local_208 = (string_view)::cm::operator____s("\nat this time.",0xe);
        cmStrCat<cm::static_string_view>
                  (&local_178,&local_1a8,&local_1f8,(static_string_view *)&local_208);
        bVar1 = FatalError(status,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        return bVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    defer_local._7_1_ = true;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,arg);
    local_218 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar2);
    local_238 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("GET_CALL_IDS",0xc);
    local_228 = local_238._M_len;
    local_220 = local_238._M_str;
    bVar1 = std::operator==(local_218,local_238);
    if (bVar1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (arg + 1 == sVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"DEFER GET_CALL_IDS missing output variable",
                   (allocator<char> *)((long)&var + 7));
        defer_local._7_1_ = FatalError(status,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)((long)&var + 7));
      }
      else {
        local_268 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](args,arg + 1);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if (arg + 2 == sVar3) {
          cmMakefile::DeferGetCallIds_abi_cxx11_
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2b8,local_6a0);
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_2b8);
          if (bVar1) {
            pcVar7 = cmExecutionStatus::GetMakefile(status);
            pvVar2 = local_268;
            pbVar8 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_2b8);
            local_380 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar8);
            cmMakefile::AddDefinition(pcVar7,pvVar2,local_380);
            defer_local._7_1_ = true;
          }
          else {
            local_328 = (string_view)
                        ::cm::operator____s("DEFER GET_CALL_IDS may not access directory:\n  ",0x2f)
            ;
            local_318 = local_328;
            cmAlphaNum::cmAlphaNum(&local_308,local_328);
            psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_6a0);
            cmAlphaNum::cmAlphaNum(&local_358,psVar6);
            local_368 = (string_view)::cm::operator____s("\nat this time.",0xe);
            cmStrCat<cm::static_string_view>
                      (&local_2d8,&local_308,&local_358,(static_string_view *)&local_368);
            defer_local._7_1_ = FatalError(status,&local_2d8);
            std::__cxx11::string::~string((string *)&local_2d8);
          }
          local_36c = 1;
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_2b8);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"DEFER GET_CALL_IDS given too many arguments",
                     (allocator<char> *)
                     &ids_1.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0x27);
          defer_local._7_1_ = FatalError(status,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &ids_1.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0x27);
        }
      }
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,arg);
      local_390 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar2);
      local_3b0 = (basic_string_view<char,_std::char_traits<char>_>)
                  ::cm::operator____s("GET_CALL",8);
      local_3a0 = local_3b0._M_len;
      local_398 = local_3b0._M_str;
      bVar1 = std::operator==(local_390,local_3b0);
      if (bVar1) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if (arg + 1 == sVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"DEFER GET_CALL missing id",
                     (allocator<char> *)((long)&id_1 + 7));
          defer_local._7_1_ = FatalError(status,&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&id_1 + 7));
        }
        else {
          local_3e0 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,arg + 1);
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (arg + 2 == sVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_400,"DEFER GET_CALL missing output variable",
                       (allocator<char> *)((long)&var_1 + 7));
            defer_local._7_1_ = FatalError(status,&local_400);
            std::__cxx11::string::~string((string *)&local_400);
            std::allocator<char>::~allocator((allocator<char> *)((long)&var_1 + 7));
          }
          else {
            local_410 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,arg + 2);
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (arg + 3 == sVar3) {
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3e0);
                if ('@' < *pcVar5) {
                  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3e0);
                  if (*pcVar5 < '[') {
                    view = (string_view)
                           ::cm::operator____s("DEFER GET_CALL unknown argument:\n ",0x22);
                    cmAlphaNum::cmAlphaNum(&local_4b0,view);
                    this = &call.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged;
                    cmAlphaNum::cmAlphaNum((cmAlphaNum *)this,local_3e0);
                    cmStrCat<>(&local_480,&local_4b0,(cmAlphaNum *)this);
                    bVar1 = FatalError(status,&local_480);
                    std::__cxx11::string::~string((string *)&local_480);
                    return bVar1;
                  }
                }
                cmMakefile::DeferGetCall
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_530,local_6a0,local_3e0);
                bVar1 = std::optional::operator_cast_to_bool((optional *)local_530);
                if (bVar1) {
                  pcVar7 = cmExecutionStatus::GetMakefile(status);
                  pvVar2 = local_410;
                  pbVar8 = std::
                           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_530);
                  local_5f8 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)pbVar8);
                  cmMakefile::AddDefinition(pcVar7,pvVar2,local_5f8);
                  defer_local._7_1_ = true;
                }
                else {
                  local_5a8 = (string_view)
                              ::cm::operator____s("DEFER GET_CALL may not access directory:\n  ",
                                                  0x2b);
                  local_598 = local_5a8;
                  cmAlphaNum::cmAlphaNum(&local_580,local_5a8);
                  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_6a0);
                  cmAlphaNum::cmAlphaNum(&local_5d8,psVar6);
                  local_5e8 = (string_view)::cm::operator____s("\nat this time.",0xe);
                  cmStrCat<cm::static_string_view>
                            (&local_550,&local_580,&local_5d8,(static_string_view *)&local_5e8);
                  defer_local._7_1_ = FatalError(status,&local_550);
                  std::__cxx11::string::~string((string *)&local_550);
                }
                local_36c = 1;
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_530);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_458,"DEFER GET_CALL id may not be empty",&local_459);
                defer_local._7_1_ = FatalError(status,&local_458);
                std::__cxx11::string::~string((string *)&local_458);
                std::allocator<char>::~allocator(&local_459);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_430,"DEFER GET_CALL given too many arguments",&local_431);
              defer_local._7_1_ = FatalError(status,&local_430);
              std::__cxx11::string::~string((string *)&local_430);
              std::allocator<char>::~allocator(&local_431);
            }
          }
        }
      }
      else {
        local_668 = (string_view)::cm::operator____s("DEFER operation unknown: ",0x19);
        local_658 = local_668._M_len;
        pcStack_650 = local_668._M_str;
        cmAlphaNum::cmAlphaNum(&local_648,local_668);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,arg);
        cmAlphaNum::cmAlphaNum(&local_698,pvVar2);
        cmStrCat<>(&local_618,&local_648,&local_698);
        defer_local._7_1_ = FatalError(status,&local_618);
        std::__cxx11::string::~string((string *)&local_618);
      }
    }
  }
  return defer_local._7_1_;
}

Assistant:

bool cmCMakeLanguageCommandDEFER(Defer const& defer,
                                 std::vector<std::string> const& args,
                                 size_t arg, cmExecutionStatus& status)
{
  cmMakefile* deferMakefile =
    defer.Directory ? defer.Directory : &status.GetMakefile();
  if (args[arg] == "CANCEL_CALL"_s) {
    ++arg; // Consume CANCEL_CALL.
    auto ids = cmMakeRange(args).advance(arg);
    for (std::string const& id : ids) {
      if (id[0] >= 'A' && id[0] <= 'Z') {
        return FatalError(
          status, cmStrCat("DEFER CANCEL_CALL unknown argument:\n  "_s, id));
      }
      if (!deferMakefile->DeferCancelCall(id)) {
        return FatalError(
          status,
          cmStrCat("DEFER CANCEL_CALL may not update directory:\n  "_s,
                   deferMakefile->GetCurrentBinaryDirectory(),
                   "\nat this time."_s));
      }
    }
    return true;
  }
  if (args[arg] == "GET_CALL_IDS"_s) {
    ++arg; // Consume GET_CALL_IDS.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS given too many arguments");
    }
    cm::optional<std::string> ids = deferMakefile->DeferGetCallIds();
    if (!ids) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL_IDS may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *ids);
    return true;
  }
  if (args[arg] == "GET_CALL"_s) {
    ++arg; // Consume GET_CALL.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing id");
    }
    std::string const& id = args[arg++];
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL given too many arguments");
    }
    if (id.empty()) {
      return FatalError(status, "DEFER GET_CALL id may not be empty");
    }
    if (id[0] >= 'A' && id[0] <= 'Z') {
      return FatalError(status,
                        cmStrCat("DEFER GET_CALL unknown argument:\n "_s, id));
    }
    cm::optional<std::string> call = deferMakefile->DeferGetCall(id);
    if (!call) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *call);
    return true;
  }
  return FatalError(status,
                    cmStrCat("DEFER operation unknown: "_s, args[arg]));
}